

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void print_stats_diff(device_stats *stats_new,device_stats *stats_old,uint64_t nanos)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  
  pcVar4 = "???";
  if (stats_new->device != (ixy_device *)0x0) {
    pcVar4 = stats_new->device->pci_addr;
  }
  uVar1 = stats_new->rx_pkts;
  uVar2 = stats_old->rx_pkts;
  uVar3 = diff_mbit(stats_new->rx_bytes,stats_old->rx_bytes,uVar1,uVar2,nanos);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1 - uVar2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = nanos;
  auVar5 = vpunpcklqdq_avx(auVar5,auVar6);
  auVar5 = vcvtuqq2pd_avx512vl(auVar5);
  auVar5 = vdivpd_avx(auVar5,_DAT_001076d0);
  auVar6 = vshufpd_avx(auVar5,auVar5,1);
  printf("[%s] RX: %d Mbit/s %.2f Mpps\n",auVar5._0_8_ / auVar6._0_8_,pcVar4,(ulong)uVar3);
  pcVar4 = "???";
  if (stats_new->device != (ixy_device *)0x0) {
    pcVar4 = stats_new->device->pci_addr;
  }
  uVar1 = stats_new->tx_pkts;
  uVar2 = stats_old->tx_pkts;
  uVar3 = diff_mbit(stats_new->tx_bytes,stats_old->tx_bytes,uVar1,uVar2,nanos);
  auVar5 = vcvtusi2sd_avx512f(in_XMM2,uVar1 - uVar2);
  printf("[%s] TX: %d Mbit/s %.2f Mpps\n",(auVar5._0_8_ / 1000000.0) / auVar6._0_8_,pcVar4,
         (ulong)uVar3);
  return;
}

Assistant:

void print_stats_diff(struct device_stats* stats_new, struct device_stats* stats_old, uint64_t nanos) {
	printf("[%s] RX: %d Mbit/s %.2f Mpps\n", stats_new->device ? stats_new->device->pci_addr : "???",
		diff_mbit(stats_new->rx_bytes, stats_old->rx_bytes, stats_new->rx_pkts, stats_old->rx_pkts, nanos),
		diff_mpps(stats_new->rx_pkts, stats_old->rx_pkts, nanos)
	);
	printf("[%s] TX: %d Mbit/s %.2f Mpps\n", stats_new->device ? stats_new->device->pci_addr : "???",
		diff_mbit(stats_new->tx_bytes, stats_old->tx_bytes, stats_new->tx_pkts, stats_old->tx_pkts, nanos),
		diff_mpps(stats_new->tx_pkts, stats_old->tx_pkts, nanos)
	);
}